

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,OutputFormat output
          )

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  if (output < RESPONSE) {
    ConvertDirectorySeparatorsForShell(&sStack_48,this,source);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    EscapeForShell(&sStack_48,this,__return_storage_ptr__,true,false,output == WATCOMQUOTE);
  }
  else {
    if (output != RESPONSE) {
      return __return_storage_ptr__;
    }
    EscapeForShell(&sStack_48,this,__return_storage_ptr__,false,false,false);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(const std::string& source,
                                                     OutputFormat output) const
{
  std::string result = source;
  // Convert it to an output path.
  if (output == SHELL || output == WATCOMQUOTE) {
    result = this->ConvertDirectorySeparatorsForShell(source);
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE);
  } else if (output == RESPONSE) {
    result = this->EscapeForShell(result, false, false, false);
  }
  return result;
}